

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void DC4_C(uint8_t *dst)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  
  pbVar2 = dst + -0x20;
  uVar1 = 4;
  lVar3 = -1;
  do {
    uVar1 = (uint)dst[lVar3] + *pbVar2 + uVar1;
    pbVar2 = pbVar2 + 1;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x7f);
  lVar3 = 0;
  do {
    *(uint *)(dst + lVar3) = (uVar1 >> 3 & 0xff) * 0x1010101;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x80);
  return;
}

Assistant:

static void DC4_C(uint8_t* dst) {   // DC
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += dst[i - BPS] + dst[-1 + i * BPS];
  dc >>= 3;
  for (i = 0; i < 4; ++i) memset(dst + i * BPS, dc, 4);
}